

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_arithm<unsigned_short>
               (uint length,unsigned_short value1,unsigned_short value2,bool allowTrash)

{
  short *psVar1;
  int i;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  shared_ptr<unsigned_short> pv1;
  shared_ptr<unsigned_short> pv2;
  shared_ptr<unsigned_short> presult;
  
  presult.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  uVar5 = (ulong)length;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar3 = uVar5 * 2;
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_short*,void(*)(unsigned_short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,p_Var2,
             nosimd::common::free<unsigned_short>);
  pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_short*,void(*)(unsigned_short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<unsigned_short>);
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar3 = (ulong)(length + 1) * 2;
  }
  pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_short*,void(*)(unsigned_short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<unsigned_short>);
  *(undefined2 *)
   ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar5 * 2) = 0x7f;
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(unsigned_short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2) = value1;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
    uVar3 = 0;
    do {
      *(unsigned_short *)
       ((long)&(pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               )->_vptr__Sp_counted_base + uVar3 * 2) = value2;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if ((*(unsigned_short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2) != value1) ||
         (*(unsigned_short *)
           ((long)&(pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + uVar3 * 2) != value2)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
        *(undefined4 *)(puVar4 + 1) = 0x1a;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (p_Var2 == pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     ) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        psVar1 = (short *)((long)&(pv2.
                                   super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2);
        *psVar1 = *psVar1 + *(short *)((long)&(pv1.
                                               super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                                      uVar3 * 2);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else if (pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
           pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        psVar1 = (short *)((long)&(pv2.
                                   super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2);
        *psVar1 = *psVar1 + *(short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) =
           *(short *)((long)&(pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) +
           *(short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2);
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) !=
          (unsigned_short)(value2 + value1)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
        *(undefined4 *)(puVar4 + 1) = 0x22;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (p_Var2 == pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     ) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        psVar1 = (short *)((long)&(pv2.
                                   super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2);
        *psVar1 = *psVar1 - *(short *)((long)&(pv1.
                                               super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                                      uVar3 * 2);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) =
           *(short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2) -
           *(short *)((long)&(pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2);
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) !=
          (unsigned_short)(value1 - value2)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
        *(undefined4 *)(puVar4 + 1) = 0x2a;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (p_Var2 == pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     ) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        *(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) =
             *(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) *
             *(short *)((long)&(pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else if (pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
           pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        *(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) =
             *(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) *
             *(short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) =
           *(short *)((long)&(pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) *
           *(short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2);
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) !=
          (unsigned_short)(value2 * value1)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
        *(undefined4 *)(puVar4 + 1) = 0x32;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (p_Var2 == pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     ) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        *(ushort *)
         ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + uVar3 * 2) =
             *(ushort *)
              ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) /
             *(ushort *)
              ((long)&(pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(ushort *)
       ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               )->_vptr__Sp_counted_base + uVar3 * 2) =
           *(ushort *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2) /
           *(ushort *)
            ((long)&(pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base + uVar3 * 2);
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if (*(ushort *)
           ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + uVar3 * 2) != value1 / value2) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
        *(undefined4 *)(puVar4 + 1) = 0x3a;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (p_Var2 == pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     ) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        psVar1 = (short *)((long)&(pv2.
                                   super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2);
        *psVar1 = *psVar1 + value2;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(unsigned_short *)
       ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               )->_vptr__Sp_counted_base + uVar3 * 2) =
           *(short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2) + value2;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) !=
          (unsigned_short)(value2 + value1)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
        *(undefined4 *)(puVar4 + 1) = 0x43;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (p_Var2 == pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     ) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        psVar1 = (short *)((long)&(pv2.
                                   super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2);
        *psVar1 = *psVar1 - value2;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(unsigned_short *)
       ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               )->_vptr__Sp_counted_base + uVar3 * 2) =
           *(short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2) - value2;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) !=
          (unsigned_short)(value1 - value2)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
        *(undefined4 *)(puVar4 + 1) = 0x4b;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        *(unsigned_short *)
         ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + uVar3 * 2) =
             value2 - *(short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    if (length != 0) {
      uVar3 = 0;
      do {
        if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) !=
            (unsigned_short)(value2 - value1)) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
          *(undefined4 *)(puVar4 + 1) = 0x53;
          *(uint *)((long)puVar4 + 0xc) = length;
          __cxa_throw(puVar4,&Exception::typeinfo,0);
        }
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  if (p_Var2 == pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     ) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        *(unsigned_short *)
         ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + uVar3 * 2) =
             *(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) * value2;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(unsigned_short *)
       ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               )->_vptr__Sp_counted_base + uVar3 * 2) =
           *(short *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2) * value2;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) !=
          (unsigned_short)(value2 * value1)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
        *(undefined4 *)(puVar4 + 1) = 0x5b;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (p_Var2 == pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     ) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        *(ushort *)
         ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + uVar3 * 2) =
             *(ushort *)
              ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) / value2;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(ushort *)
       ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               )->_vptr__Sp_counted_base + uVar3 * 2) =
           *(ushort *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2) / value2;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if (*(ushort *)
           ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + uVar3 * 2) != value1 / value2) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
        *(undefined4 *)(puVar4 + 1) = 99;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        *(ushort *)
         ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + uVar3 * 2) =
             value2 / *(ushort *)((long)&p_Var2->_vptr__Sp_counted_base + uVar3 * 2);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    if (length != 0) {
      uVar3 = 0;
      do {
        if (*(ushort *)
             ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) != value2 / value1) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
          *(undefined4 *)(puVar4 + 1) = 0x6b;
          *(uint *)((long)puVar4 + 0xc) = length;
          __cxa_throw(puVar4,&Exception::typeinfo,0);
        }
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  if ((presult.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _4_1_ == '\0') &&
     (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5 * 2) != 0x7f)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
    *(undefined4 *)(puVar4 + 1) = 0x70;
    *(uint *)((long)puVar4 + 0xc) = length;
    __cxa_throw(puVar4,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}